

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::MatchLiteralNode::Print(MatchLiteralNode *this,DebugWriter *w,Char *litbuf)

{
  int iVar1;
  uint local_2c;
  int local_28;
  CharCount j;
  int i;
  int skip;
  Char *litbuf_local;
  DebugWriter *w_local;
  MatchLiteralNode *this_local;
  
  DebugWriter::Print(w,L"MatchLiteral(");
  iVar1 = 1;
  if ((this->isEquivClass & 1U) != 0) {
    iVar1 = 4;
  }
  for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
    if (0 < local_28) {
      DebugWriter::Print(w,L", ");
    }
    DebugWriter::Print(w,L"\"");
    for (local_2c = 0; local_2c < this->length; local_2c = local_2c + 1) {
      DebugWriter::PrintEscapedChar(w,litbuf[this->offset + local_2c * iVar1 + local_28]);
    }
    DebugWriter::Print(w,L"\"");
  }
  DebugWriter::PrintEOL(w,L")");
  Node::PrintAnnotations(&this->super_Node,w);
  return;
}

Assistant:

void MatchLiteralNode::Print(DebugWriter* w, const Char* litbuf) const
    {
        w->Print(_u("MatchLiteral("));
        int skip = isEquivClass ? CaseInsensitive::EquivClassSize : 1;
        for (int i = 0; i < skip; i++)
        {
            if (i > 0)
                w->Print(_u(", "));
            w->Print(_u("\""));
            for (CharCount j = 0; j < length; j++)
                w->PrintEscapedChar(litbuf[offset + j * skip + i]);
            w->Print(_u("\""));
        }
        w->PrintEOL(_u(")"));
        PrintAnnotations(w);
    }